

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O3

Matrix44<float> * __thiscall Imath_3_2::Frustum<float>::projectionMatrix(Frustum<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  Matrix44<float> *in_RDI;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar1 = this->_right;
  uVar2 = this->_top;
  auVar8._0_4_ = (float)uVar1 + this->_left;
  auVar8._4_4_ = (float)uVar2 + this->_bottom;
  auVar8._8_4_ = this->_top + 0.0;
  auVar8._12_4_ = this->_bottom + 0.0;
  fVar11 = (float)uVar1 - this->_left;
  fVar13 = (float)uVar2 - this->_bottom;
  fVar14 = 0.0 - this->_top;
  fVar15 = 0.0 - this->_bottom;
  fVar12 = this->_nearPlane;
  fVar16 = this->_farPlane;
  fVar10 = fVar16 - fVar12;
  if (this->_orthographic == true) {
    uVar5 = CONCAT44(auVar8._4_4_,auVar8._0_4_);
    auVar7._0_8_ = uVar5 ^ 0x8000000080000000;
    auVar7._8_4_ = -auVar8._8_4_;
    auVar7._12_4_ = -auVar8._12_4_;
    auVar3._4_4_ = fVar13;
    auVar3._0_4_ = fVar11;
    auVar3._8_4_ = fVar14;
    auVar3._12_4_ = fVar15;
    auVar8 = divps(auVar7,auVar3);
    uVar6 = auVar8._0_8_;
    fVar9 = -(fVar16 + fVar12);
    in_RDI->x[0][0] = 2.0 / fVar11;
    *(float *)((long)(in_RDI->x + 0) + 4) = 0.0;
    *(float *)((long)(in_RDI->x + 0) + 8) = 0.0;
    *(undefined8 *)(in_RDI->x[0] + 3) = 0;
    in_RDI->x[1][1] = 2.0 / fVar13;
    *(float *)((long)(in_RDI->x + 1) + 8) = 0.0;
    *(float *)((long)(in_RDI->x + 1) + 0xc) = 0.0;
    *(float *)((long)(in_RDI->x + 2) + 0) = 0.0;
    *(float *)((long)(in_RDI->x + 2) + 4) = 0.0;
    in_RDI->x[2][2] = -2.0 / fVar10;
    fVar12 = 1.0;
    fVar16 = 0.0;
  }
  else {
    fVar9 = fVar16 * -2.0 * fVar12;
    auVar4._4_4_ = fVar13;
    auVar4._0_4_ = fVar11;
    auVar4._8_4_ = fVar14;
    auVar4._12_4_ = fVar15;
    auVar8 = divps(auVar8,auVar4);
    in_RDI->x[0][0] = (fVar12 + fVar12) / fVar11;
    *(float *)((long)(in_RDI->x + 0) + 4) = 0.0;
    *(float *)((long)(in_RDI->x + 0) + 8) = 0.0;
    *(undefined8 *)(in_RDI->x[0] + 3) = 0;
    in_RDI->x[1][1] = (fVar12 + fVar12) / fVar13;
    *(float *)((long)(in_RDI->x + 1) + 8) = 0.0;
    *(float *)((long)(in_RDI->x + 1) + 0xc) = 0.0;
    *(long *)in_RDI->x[2] = auVar8._0_8_;
    in_RDI->x[2][2] = -(fVar16 + fVar12) / fVar10;
    fVar12 = 0.0;
    fVar16 = -1.0;
    uVar6 = 0;
  }
  in_RDI->x[2][3] = fVar16;
  *(undefined8 *)in_RDI->x[3] = uVar6;
  in_RDI->x[3][2] = fVar9 / fVar10;
  in_RDI->x[3][3] = fVar12;
  return in_RDI;
}

Assistant:

IMATH_CONSTEXPR14 inline Matrix44<T>
Frustum<T>::projectionMatrix () const IMATH_NOEXCEPT
{
    T rightPlusLeft  = _right + _left;
    T rightMinusLeft = _right - _left;

    T topPlusBottom  = _top + _bottom;
    T topMinusBottom = _top - _bottom;

    T farPlusNear  = _farPlane + _nearPlane;
    T farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T tx = -rightPlusLeft / rightMinusLeft;
        T ty = -topPlusBottom / topMinusBottom;
        T tz = -farPlusNear / farMinusNear;

        T A = T (2) / rightMinusLeft;
        T B = T (2) / topMinusBottom;
        T C = T (-2) / farMinusNear;

        return Matrix44<T> (
            A, 0, 0, 0, 0, B, 0, 0, 0, 0, C, 0, tx, ty, tz, 1.f);
    }
    else
    {
        T A = rightPlusLeft / rightMinusLeft;
        T B = topPlusBottom / topMinusBottom;
        T C = -farPlusNear / farMinusNear;

        T farTimesNear = T (-2) * _farPlane * _nearPlane;

        T D = farTimesNear / farMinusNear;

        T twoTimesNear = T (2) * _nearPlane;

        T E = twoTimesNear / rightMinusLeft;
        T F = twoTimesNear / topMinusBottom;

        return Matrix44<T> (E, 0, 0, 0, 0, F, 0, 0, A, B, C, -1, 0, 0, D, 0);
    }
}